

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O1

timespec * Time::getInitialTimespec(void)

{
  int iVar1;
  timespec *in_RAX;
  timespec mt;
  TimeVal now_1;
  timespec local_28;
  timeval local_18;
  
  if (getInitialTimespec()::initialized == '\0') {
    iVar1 = clock_gettime(0,(timespec *)&getInitialTimespec::ts);
    if (iVar1 == 0x16) {
      gettimeofday((timeval *)&local_28,(__timezone_ptr_t)0x0);
      getInitialTimespec::ts.tv_sec = local_28.tv_sec;
      getInitialTimespec::ts.tv_nsec = local_28.tv_nsec * 1000;
    }
    iVar1 = clock_gettime(1,&local_28);
    if (iVar1 == 0x16) {
      gettimeofday(&local_18,(__timezone_ptr_t)0x0);
      local_28.tv_sec = local_18.tv_sec;
      local_28.tv_nsec = local_18.tv_usec * 1000;
    }
    getInitialTimespec::ts.tv_sec = getInitialTimespec::ts.tv_sec - local_28.tv_sec;
    if (getInitialTimespec::ts.tv_nsec < local_28.tv_nsec) {
      getInitialTimespec::ts.tv_sec = getInitialTimespec::ts.tv_sec + -1;
      getInitialTimespec::ts.tv_nsec = getInitialTimespec::ts.tv_nsec + 1000000000;
    }
    getInitialTimespec::ts.tv_nsec = getInitialTimespec::ts.tv_nsec - local_28.tv_nsec;
    getInitialTimespec()::initialized = '\x01';
    in_RAX = (timespec *)local_28.tv_nsec;
  }
  return in_RAX;
}

Assistant:

static struct timespec & getInitialTimespec()
    {
        static struct timespec ts;
        struct timespec mt;
        static bool initialized = false;
        if (!initialized)
        {
            if (clock_gettime(CLOCK_REALTIME, &ts) == EINVAL)
            {
                TimeVal now;
                gettimeofday(&now, NULL);
                ts.tv_sec = now.tv_sec;
                ts.tv_nsec = now.tv_usec * 1000;
            }
            if (clock_gettime(CLOCK_MONOTONIC, &mt) == EINVAL)
            {
                TimeVal now;
                gettimeofday(&now, NULL);
                mt.tv_sec = now.tv_sec;
                mt.tv_nsec = now.tv_usec * 1000;
            }
            ts.tv_sec -= mt.tv_sec;
            if (mt.tv_nsec > ts.tv_nsec) { ts.tv_sec --; ts.tv_nsec = ts.tv_nsec + 1000000000 - mt.tv_nsec; }
            else ts.tv_nsec -= mt.tv_nsec;
            initialized = true;
        }
        return ts;
    }